

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.cc
# Opt level: O3

int __thiscall
xLearn::Predictor::sign
          (Predictor *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  Logger local_6c;
  string local_68;
  string local_48;
  
  lVar1 = *(long *)ctx;
  lVar2 = *(long *)sig;
  lVar5 = *(long *)(ctx + 8) - lVar1;
  if (lVar5 == *(long *)(sig + 8) - lVar2) {
    if (*(long *)(ctx + 8) != lVar1) {
      lVar5 = lVar5 >> 2;
      lVar6 = 0;
      do {
        uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416(*(uint *)(lVar1 + lVar6 * 4)),1);
        *(uint *)(lVar2 + lVar6 * 4) = (uint)((byte)uVar3 & 1) * 0x3f800000;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    return (int)lVar1;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_6c.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.cc"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sign","");
  poVar4 = Logger::Start(ERR,&local_48,0x50,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_EQ failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.cc"
             ,0x60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"in.size()",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"out.size()",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void Predictor::sign(std::vector<real_t>& in, 
                     std::vector<real_t>& out) {
  CHECK_EQ(in.size(), out.size());
  for (size_t i = 0; i < in.size(); ++i) {
    out[i] = in[i] > 0 ? 1 : 0;
  }
}